

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_itrans_recon_sse42_intr.c
# Opt level: O2

void ihevc_itrans_recon_4x4_ttype1_sse42
               (WORD16 *pi2_src,WORD16 *pi2_tmp,UWORD8 *pu1_pred,UWORD8 *pu1_dst,WORD32 src_strd,
               WORD32 pred_strd,WORD32 dst_strd,WORD32 zero_cols,WORD32 zero_rows)

{
  WORD16 *pWVar1;
  long lVar2;
  long lVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  short sVar21;
  int iVar22;
  int iVar23;
  int iVar30;
  int iVar33;
  undefined1 in_XMM4 [16];
  undefined1 auVar24 [16];
  int iVar35;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar32;
  int iVar34;
  int iVar36;
  undefined1 auVar29 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined4 uVar48;
  undefined1 auVar47 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  int iVar53;
  int iVar59;
  int iVar60;
  undefined1 in_XMM8 [16];
  undefined1 auVar54 [16];
  int iVar61;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar62 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar28 [16];
  undefined4 uVar31;
  undefined4 uVar42;
  
  lVar2 = (long)dst_strd;
  auVar43 = pmovsxwd(in_XMM6,*(undefined8 *)pi2_src);
  pWVar1 = pi2_src + src_strd;
  auVar24 = pmovsxwd(in_XMM4,*(undefined8 *)pWVar1);
  auVar54 = pmovsxwd(in_XMM8,*(undefined8 *)(pWVar1 + src_strd));
  auVar49 = pmovsxwd(in_XMM7,*(undefined8 *)(pWVar1 + src_strd + src_strd));
  iVar22 = auVar43._0_4_;
  iVar53 = auVar54._0_4_;
  iVar30 = auVar43._4_4_;
  iVar59 = auVar54._4_4_;
  iVar33 = auVar43._8_4_;
  iVar35 = auVar43._12_4_;
  iVar60 = auVar54._8_4_;
  iVar61 = auVar54._12_4_;
  auVar43 = pmulld(auVar24,(undefined1  [16])g_ai4_ihevc_trans_4_ttype1[2]);
  iVar23 = auVar49._0_4_;
  auVar37._0_4_ = iVar23 + iVar53;
  iVar32 = auVar49._4_4_;
  auVar37._4_4_ = iVar32 + iVar59;
  iVar34 = auVar49._8_4_;
  iVar36 = auVar49._12_4_;
  auVar37._8_4_ = iVar34 + iVar60;
  auVar37._12_4_ = iVar36 + iVar61;
  auVar55._0_4_ = iVar53 + iVar22;
  auVar55._4_4_ = iVar59 + iVar30;
  auVar55._8_4_ = iVar60 + iVar33;
  auVar55._12_4_ = iVar61 + iVar35;
  auVar44._0_4_ = iVar22 - iVar23;
  auVar44._4_4_ = iVar30 - iVar32;
  auVar44._8_4_ = iVar33 - iVar34;
  auVar44._12_4_ = iVar35 - iVar36;
  auVar54._0_4_ = (iVar22 - iVar53) + iVar23;
  auVar54._4_4_ = (iVar30 - iVar59) + iVar32;
  auVar54._8_4_ = (iVar33 - iVar60) + iVar34;
  auVar54._12_4_ = (iVar35 - iVar61) + iVar36;
  auVar50 = pmulld((undefined1  [16])g_ai4_ihevc_trans_4_ttype1[0],auVar55);
  auVar56 = pmulld(auVar55,(undefined1  [16])g_ai4_ihevc_trans_4_ttype1[1]);
  auVar62 = pmulld((undefined1  [16])g_ai4_ihevc_trans_4_ttype1[1],auVar37);
  auVar49 = pmulld(auVar37,(undefined1  [16])g_ai4_ihevc_trans_4_ttype1[0]);
  auVar57 = pmulld(auVar44,(undefined1  [16])g_ai4_ihevc_trans_4_ttype1[0]);
  auVar45 = pmulld(auVar44,(undefined1  [16])g_ai4_ihevc_trans_4_ttype1[1]);
  auVar24 = pmulld(auVar54,(undefined1  [16])g_ai4_ihevc_trans_4_ttype1[2]);
  auVar54 = pmovsxbd(in_XMM10,0x40404040);
  auVar46._0_4_ = auVar45._0_4_ - auVar43._0_4_;
  auVar46._4_4_ = auVar45._4_4_ - auVar43._4_4_;
  auVar46._8_4_ = auVar45._8_4_ - auVar43._8_4_;
  auVar46._12_4_ = auVar45._12_4_ - auVar43._12_4_;
  iVar23 = auVar54._0_4_;
  iVar22 = auVar43._0_4_ + iVar23;
  iVar32 = auVar54._4_4_;
  iVar30 = auVar43._4_4_ + iVar32;
  iVar34 = auVar54._8_4_;
  iVar33 = auVar43._8_4_ + iVar34;
  iVar36 = auVar54._12_4_;
  iVar35 = auVar43._12_4_ + iVar36;
  auVar38._0_4_ = auVar49._0_4_ + auVar56._0_4_ + iVar22 >> 7;
  auVar38._4_4_ = auVar49._4_4_ + auVar56._4_4_ + iVar30 >> 7;
  auVar38._8_4_ = auVar49._8_4_ + auVar56._8_4_ + iVar33 >> 7;
  auVar38._12_4_ = auVar49._12_4_ + auVar56._12_4_ + iVar35 >> 7;
  auVar25._0_4_ = (iVar22 + auVar57._0_4_) - auVar62._0_4_ >> 7;
  auVar25._4_4_ = (iVar30 + auVar57._4_4_) - auVar62._4_4_ >> 7;
  auVar25._8_4_ = (iVar33 + auVar57._8_4_) - auVar62._8_4_ >> 7;
  auVar25._12_4_ = (iVar35 + auVar57._12_4_) - auVar62._12_4_ >> 7;
  auVar43 = packssdw(auVar38,auVar25);
  auVar51._0_4_ = auVar50._0_4_ + iVar23 + auVar46._0_4_ >> 7;
  auVar51._4_4_ = auVar50._4_4_ + iVar32 + auVar46._4_4_ >> 7;
  auVar51._8_4_ = auVar50._8_4_ + iVar34 + auVar46._8_4_ >> 7;
  auVar51._12_4_ = auVar50._12_4_ + iVar36 + auVar46._12_4_ >> 7;
  auVar50._0_4_ = auVar24._0_4_ + iVar23 >> 7;
  auVar50._4_4_ = auVar24._4_4_ + iVar32 >> 7;
  auVar50._8_4_ = auVar24._8_4_ + iVar34 >> 7;
  auVar50._12_4_ = auVar24._12_4_ + iVar36 >> 7;
  auVar24 = packssdw(auVar50,auVar51);
  auVar26._4_4_ = auVar43._8_4_;
  auVar26._0_4_ = auVar43._0_4_;
  auVar26._8_4_ = auVar43._4_4_;
  auVar26._12_4_ = auVar43._12_4_;
  auVar49 = pshufhw(auVar43,auVar26,0xd8);
  auVar43 = pshuflw(auVar26,auVar26,0xd8);
  auVar56._0_4_ = auVar24._0_4_;
  auVar56._12_4_ = auVar24._12_4_;
  auVar56._4_4_ = auVar24._8_4_;
  auVar56._8_4_ = auVar24._4_4_;
  auVar54 = pshufhw(auVar46,auVar56,0xd8);
  auVar39._4_4_ = auVar54._8_4_;
  auVar39._0_4_ = auVar49._8_4_;
  uVar42 = auVar49._12_4_;
  auVar39._8_4_ = uVar42;
  uVar48 = auVar54._12_4_;
  auVar39._12_4_ = uVar48;
  auVar24 = pshuflw(auVar56,auVar56,0xd8);
  auVar62._4_4_ = auVar24._4_4_;
  uVar31 = auVar43._4_4_;
  auVar28._0_8_ = auVar43._0_8_;
  auVar28._8_4_ = uVar31;
  auVar28._12_4_ = auVar62._4_4_;
  auVar27._8_8_ = auVar28._8_8_;
  auVar27._0_4_ = auVar43._0_4_;
  auVar27._4_4_ = auVar24._0_4_;
  auVar43 = pmovsxwd(auVar54,auVar27);
  auVar49 = pmovsxwd(auVar57,auVar39);
  auVar62._0_4_ = uVar31;
  auVar62._8_4_ = uVar31;
  auVar62._12_4_ = auVar62._4_4_;
  auVar24 = pmovsxwd(auVar27,auVar62);
  auVar57._4_4_ = uVar48;
  auVar57._0_4_ = uVar42;
  auVar57._8_4_ = uVar42;
  auVar57._12_4_ = uVar48;
  auVar54 = pmovsxwd(auVar51,auVar57);
  iVar22 = auVar43._0_4_;
  iVar53 = auVar49._0_4_;
  iVar30 = auVar43._4_4_;
  iVar59 = auVar49._4_4_;
  iVar33 = auVar43._8_4_;
  iVar35 = auVar43._12_4_;
  iVar60 = auVar49._8_4_;
  iVar61 = auVar49._12_4_;
  auVar49 = pmulld(auVar24,(undefined1  [16])g_ai4_ihevc_trans_4_ttype1[2]);
  auVar40._0_4_ = iVar22 + iVar53;
  auVar40._4_4_ = iVar30 + iVar59;
  auVar40._8_4_ = iVar33 + iVar60;
  auVar40._12_4_ = iVar35 + iVar61;
  iVar23 = auVar54._0_4_;
  auVar58._0_4_ = iVar53 + iVar23;
  iVar32 = auVar54._4_4_;
  auVar58._4_4_ = iVar59 + iVar32;
  iVar34 = auVar54._8_4_;
  auVar58._8_4_ = iVar60 + iVar34;
  iVar36 = auVar54._12_4_;
  auVar58._12_4_ = iVar61 + iVar36;
  auVar47._0_4_ = iVar22 - iVar23;
  auVar47._4_4_ = iVar30 - iVar32;
  auVar47._8_4_ = iVar33 - iVar34;
  auVar47._12_4_ = iVar35 - iVar36;
  auVar13._0_4_ = (iVar22 - iVar53) + iVar23;
  auVar13._4_4_ = (iVar30 - iVar59) + iVar32;
  auVar13._8_4_ = (iVar33 - iVar60) + iVar34;
  auVar13._12_4_ = (iVar35 - iVar61) + iVar36;
  auVar62 = pmulld(auVar40,(undefined1  [16])g_ai4_ihevc_trans_4_ttype1[1]);
  auVar50 = pmulld(auVar58,(undefined1  [16])g_ai4_ihevc_trans_4_ttype1[0]);
  auVar57 = pmulld(auVar47,(undefined1  [16])g_ai4_ihevc_trans_4_ttype1[0]);
  auVar54 = pmulld(auVar40,(undefined1  [16])g_ai4_ihevc_trans_4_ttype1[0]);
  auVar45 = pmulld(auVar47,(undefined1  [16])g_ai4_ihevc_trans_4_ttype1[1]);
  auVar24 = pmulld(auVar13,(undefined1  [16])g_ai4_ihevc_trans_4_ttype1[2]);
  auVar43 = pmovsxwd((undefined1  [16])g_ai4_ihevc_trans_4_ttype1[0],0x800080008000800);
  iVar22 = auVar43._0_4_;
  iVar23 = auVar49._0_4_ + iVar22;
  iVar30 = auVar43._4_4_;
  iVar32 = auVar49._4_4_ + iVar30;
  iVar33 = auVar43._8_4_;
  iVar34 = auVar49._8_4_ + iVar33;
  iVar35 = auVar43._12_4_;
  iVar36 = auVar49._12_4_ + iVar35;
  auVar56 = pmulld(auVar58,(undefined1  [16])g_ai4_ihevc_trans_4_ttype1[1]);
  auVar52._0_4_ = auVar50._0_4_ + auVar62._0_4_ + iVar23 >> 0xc;
  auVar52._4_4_ = auVar50._4_4_ + auVar62._4_4_ + iVar32 >> 0xc;
  auVar52._8_4_ = auVar50._8_4_ + auVar62._8_4_ + iVar34 >> 0xc;
  auVar52._12_4_ = auVar50._12_4_ + auVar62._12_4_ + iVar36 >> 0xc;
  auVar29._0_4_ = (iVar23 + auVar57._0_4_) - auVar56._0_4_ >> 0xc;
  auVar29._4_4_ = (iVar32 + auVar57._4_4_) - auVar56._4_4_ >> 0xc;
  auVar29._8_4_ = (iVar34 + auVar57._8_4_) - auVar56._8_4_ >> 0xc;
  auVar29._12_4_ = (iVar36 + auVar57._12_4_) - auVar56._12_4_ >> 0xc;
  auVar50 = packssdw(auVar52,auVar29);
  auVar41._0_4_ = (auVar54._0_4_ - auVar49._0_4_) + auVar45._0_4_ + iVar22 >> 0xc;
  auVar41._4_4_ = (auVar54._4_4_ - auVar49._4_4_) + auVar45._4_4_ + iVar30 >> 0xc;
  auVar41._8_4_ = (auVar54._8_4_ - auVar49._8_4_) + auVar45._8_4_ + iVar33 >> 0xc;
  auVar41._12_4_ = (auVar54._12_4_ - auVar49._12_4_) + auVar45._12_4_ + iVar35 >> 0xc;
  auVar14._0_4_ = auVar24._0_4_ + iVar22 >> 0xc;
  auVar14._4_4_ = auVar24._4_4_ + iVar30 >> 0xc;
  auVar14._8_4_ = auVar24._8_4_ + iVar33 >> 0xc;
  auVar14._12_4_ = auVar24._12_4_ + iVar35 >> 0xc;
  auVar49 = packssdw(auVar14,auVar41);
  auVar24._4_4_ = auVar50._8_4_;
  auVar24._0_4_ = auVar50._0_4_;
  auVar24._8_4_ = auVar50._4_4_;
  auVar24._12_4_ = auVar50._12_4_;
  auVar54 = pshufhw(auVar43,auVar24,0xd8);
  auVar24 = pshuflw(auVar24,auVar24,0xd8);
  auVar45._4_4_ = auVar49._8_4_;
  auVar45._0_4_ = auVar49._0_4_;
  auVar45._8_4_ = auVar49._4_4_;
  auVar45._12_4_ = auVar49._12_4_;
  auVar56 = pshufhw(auVar49,auVar45,0xd8);
  auVar45 = pshuflw(auVar45,auVar45,0xd8);
  auVar62 = pmovzxbw(auVar56,*(undefined8 *)pu1_pred);
  auVar43._0_8_ = auVar24._0_8_;
  auVar43._8_4_ = auVar24._4_4_;
  auVar43._12_4_ = auVar45._4_4_;
  auVar49._8_8_ = auVar43._8_8_;
  auVar49._0_4_ = auVar24._0_4_;
  auVar49._4_4_ = auVar45._0_4_;
  lVar3 = (long)pred_strd;
  auVar43 = pmovzxbw(auVar45,*(undefined8 *)(pu1_pred + lVar3));
  auVar50 = pmovzxbw(auVar43,*(undefined8 *)(pu1_pred + lVar3 * 2));
  sVar12 = auVar62._0_2_ + auVar24._0_2_;
  sVar15 = auVar62._2_2_ + auVar24._2_2_;
  sVar16 = auVar62._4_2_ + auVar45._0_2_;
  sVar17 = auVar62._6_2_ + auVar45._2_2_;
  sVar18 = auVar43._0_2_ + auVar24._4_2_;
  sVar19 = auVar43._2_2_ + auVar24._6_2_;
  sVar20 = auVar43._4_2_ + auVar45._4_2_;
  sVar21 = auVar43._6_2_ + auVar45._6_2_;
  auVar24 = pmovzxbw(auVar49,*(undefined8 *)(pu1_pred + lVar3 * 3));
  sVar4 = auVar50._0_2_ + auVar54._8_2_;
  sVar5 = auVar50._2_2_ + auVar54._10_2_;
  sVar6 = auVar50._4_2_ + auVar56._8_2_;
  sVar7 = auVar50._6_2_ + auVar56._10_2_;
  sVar8 = auVar24._0_2_ + auVar54._12_2_;
  sVar9 = auVar24._2_2_ + auVar54._14_2_;
  sVar10 = auVar24._4_2_ + auVar56._12_2_;
  sVar11 = auVar24._6_2_ + auVar56._14_2_;
  *pu1_dst = (0 < sVar12) * (sVar12 < 0x100) * (char)sVar12 - (0xff < sVar12);
  pu1_dst[1] = (0 < sVar15) * (sVar15 < 0x100) * (char)sVar15 - (0xff < sVar15);
  pu1_dst[2] = (0 < sVar16) * (sVar16 < 0x100) * (char)sVar16 - (0xff < sVar16);
  pu1_dst[3] = (0 < sVar17) * (sVar17 < 0x100) * (char)sVar17 - (0xff < sVar17);
  pu1_dst[lVar2 + 4] = (0 < sVar18) * (sVar18 < 0x100) * (char)sVar18 - (0xff < sVar18);
  pu1_dst[lVar2 + 5] = (0 < sVar19) * (sVar19 < 0x100) * (char)sVar19 - (0xff < sVar19);
  pu1_dst[lVar2 + 6] = (0 < sVar20) * (sVar20 < 0x100) * (char)sVar20 - (0xff < sVar20);
  pu1_dst[lVar2 + 7] = (0 < sVar21) * (sVar21 < 0x100) * (char)sVar21 - (0xff < sVar21);
  lVar3 = lVar2 * 2;
  pu1_dst[lVar3 + 8] = (0 < sVar4) * (sVar4 < 0x100) * (char)sVar4 - (0xff < sVar4);
  pu1_dst[lVar3 + 9] = (0 < sVar5) * (sVar5 < 0x100) * (char)sVar5 - (0xff < sVar5);
  pu1_dst[lVar3 + 10] = (0 < sVar6) * (sVar6 < 0x100) * (char)sVar6 - (0xff < sVar6);
  pu1_dst[lVar3 + 0xb] = (0 < sVar7) * (sVar7 < 0x100) * (char)sVar7 - (0xff < sVar7);
  lVar2 = lVar2 * 3;
  pu1_dst[lVar2 + 0xc] = (0 < sVar8) * (sVar8 < 0x100) * (char)sVar8 - (0xff < sVar8);
  pu1_dst[lVar2 + 0xd] = (0 < sVar9) * (sVar9 < 0x100) * (char)sVar9 - (0xff < sVar9);
  pu1_dst[lVar2 + 0xe] = (0 < sVar10) * (sVar10 < 0x100) * (char)sVar10 - (0xff < sVar10);
  pu1_dst[lVar2 + 0xf] = (0 < sVar11) * (sVar11 < 0x100) * (char)sVar11 - (0xff < sVar11);
  return;
}

Assistant:

void ihevc_itrans_recon_4x4_ttype1_sse42(WORD16 *pi2_src,
                                         WORD16 *pi2_tmp,
                                         UWORD8 *pu1_pred,
                                         UWORD8 *pu1_dst,
                                         WORD32 src_strd,
                                         WORD32 pred_strd,
                                         WORD32 dst_strd,
                                         WORD32 zero_cols,
                                         WORD32 zero_rows)
{
    __m128i m_temp_reg_0;
    __m128i m_temp_reg_1;
    __m128i m_temp_reg_2;
    __m128i m_temp_reg_3;
    __m128i m_temp_reg_4;
    __m128i m_temp_reg_10;
    __m128i m_temp_reg_11;
    __m128i m_temp_reg_12;
    __m128i m_temp_reg_13;
    __m128i m_temp_reg_14;
    __m128i m_temp_reg_20;
    __m128i m_temp_reg_21;
    __m128i m_temp_reg_22;
    __m128i m_temp_reg_23;
    __m128i m_temp_reg_24;
    __m128i m_temp_reg_25;
    __m128i m_temp_reg_30;
    __m128i m_temp_reg_31;
    __m128i m_temp_reg_32;
    __m128i m_temp_reg_33;
    __m128i m_temp_reg_34;
    __m128i m_temp_reg_35;
    __m128i m_temp_reg_36;
    __m128i m_coeff1, m_coeff2, m_coeff3;
    __m128i m_rdng_factor;
    __m128i m_count;

    WORD32 i4_shift = IT_SHIFT_STAGE_1;
    UNUSED(zero_rows);
    UNUSED(zero_cols);
    UNUSED(pi2_tmp);

    m_coeff3 = _mm_loadu_si128((__m128i *)&g_ai4_ihevc_trans_4_ttype1[2][0]); //74

    m_temp_reg_0 = _mm_loadl_epi64((__m128i *)pi2_src);
    pi2_src += src_strd;
    m_temp_reg_1 = _mm_loadl_epi64((__m128i *)pi2_src);
    pi2_src += src_strd;
    m_temp_reg_2 = _mm_loadl_epi64((__m128i *)pi2_src);
    pi2_src += src_strd;
    m_temp_reg_3 = _mm_loadl_epi64((__m128i *)pi2_src);

    m_temp_reg_0 = _mm_cvtepi16_epi32(m_temp_reg_0);
    m_temp_reg_2 = _mm_cvtepi16_epi32(m_temp_reg_2);

    m_temp_reg_1 = _mm_cvtepi16_epi32(m_temp_reg_1);
    m_temp_reg_3 = _mm_cvtepi16_epi32(m_temp_reg_3);

    /* c[4] in m_temp_reg_14 */
    /* c[4] = src[0] - src[2] + src[3] */
    {
        m_temp_reg_14 = _mm_sub_epi32(m_temp_reg_0, m_temp_reg_2);
    }

    /* c[3] in m_temp_reg_13 */
    {
        m_temp_reg_13 = _mm_mullo_epi32(m_temp_reg_1, m_coeff3);
    }

    /* c[0] in m_temp_reg_10 */
    {
        m_temp_reg_10 = _mm_add_epi32(m_temp_reg_0, m_temp_reg_2);
    }

    /* c[1] in m_temp_reg_11 */
    {
        m_temp_reg_11 = _mm_add_epi32(m_temp_reg_2, m_temp_reg_3);
    }

    /* c[2] in m_temp_reg_12 */
    {
        m_temp_reg_12 = _mm_sub_epi32(m_temp_reg_0, m_temp_reg_3);
    }

    /* c[4] in m_temp_reg_14 */
    /* c[4] = src[0] - src[2] + src[3] */
    {
        m_temp_reg_14 = _mm_add_epi32(m_temp_reg_14, m_temp_reg_3);
    }

    m_coeff1 = _mm_loadu_si128((__m128i *)&g_ai4_ihevc_trans_4_ttype1[1][0]); //29
    m_coeff2 = _mm_loadu_si128((__m128i *)&g_ai4_ihevc_trans_4_ttype1[0][0]); //55

    /* Stage 1 outputs stored in m_temp_reg_20-23 */
    {
        m_temp_reg_30 = _mm_mullo_epi32(m_temp_reg_10, m_coeff1); //29*c0
        m_temp_reg_31 = _mm_mullo_epi32(m_temp_reg_11, m_coeff2); //55*c1

        m_rdng_factor = _mm_cvtsi32_si128((1 << (i4_shift - 1)));

        m_temp_reg_32 = _mm_mullo_epi32(m_temp_reg_11, m_coeff1); //29*c1
        m_temp_reg_33 = _mm_mullo_epi32(m_temp_reg_12, m_coeff2); //55*c2

        m_rdng_factor = _mm_unpacklo_epi32(m_rdng_factor, m_rdng_factor);

        m_temp_reg_34 = _mm_mullo_epi32(m_temp_reg_10, m_coeff2); //55*c0
        m_temp_reg_35 = _mm_mullo_epi32(m_temp_reg_12, m_coeff1); //29*c2
        m_temp_reg_36 = _mm_mullo_epi32(m_temp_reg_14, m_coeff3); //74*c4

        m_rdng_factor = _mm_unpacklo_epi64(m_rdng_factor, m_rdng_factor);
        m_count = _mm_cvtsi32_si128(i4_shift);

        m_temp_reg_20 = _mm_add_epi32(m_temp_reg_30, m_temp_reg_31);
        m_temp_reg_4 = _mm_add_epi32(m_rdng_factor, m_temp_reg_13);
        m_temp_reg_20 = _mm_add_epi32(m_temp_reg_20, m_temp_reg_4);

        m_temp_reg_21 = _mm_sub_epi32(m_temp_reg_33, m_temp_reg_32);
        m_temp_reg_21 = _mm_add_epi32(m_temp_reg_21, m_temp_reg_4);

        m_temp_reg_23 = _mm_add_epi32(m_temp_reg_34, m_temp_reg_35);
        m_temp_reg_4 = _mm_sub_epi32(m_rdng_factor, m_temp_reg_13);
        m_temp_reg_23 = _mm_add_epi32(m_temp_reg_23, m_temp_reg_4);

        m_temp_reg_22 = _mm_add_epi32(m_temp_reg_36, m_rdng_factor);

        m_temp_reg_20 = _mm_sra_epi32(m_temp_reg_20, m_count);
        m_temp_reg_21 = _mm_sra_epi32(m_temp_reg_21, m_count);
        m_temp_reg_23 = _mm_sra_epi32(m_temp_reg_23, m_count);
        m_temp_reg_22 = _mm_sra_epi32(m_temp_reg_22, m_count);

        m_temp_reg_20 = _mm_packs_epi32(m_temp_reg_20, m_temp_reg_21);
        m_temp_reg_21 = _mm_packs_epi32(m_temp_reg_22, m_temp_reg_23);
        m_temp_reg_22 = _mm_srli_si128(m_temp_reg_20, 8);
        m_temp_reg_23 = _mm_srli_si128(m_temp_reg_21, 8);

        m_temp_reg_24 = _mm_unpacklo_epi16(m_temp_reg_20, m_temp_reg_22);
        m_temp_reg_25 = _mm_unpacklo_epi16(m_temp_reg_21, m_temp_reg_23);

        m_temp_reg_20 = _mm_unpacklo_epi32(m_temp_reg_24, m_temp_reg_25);
        m_temp_reg_21 = _mm_unpackhi_epi32(m_temp_reg_24, m_temp_reg_25);

    }

    /* Stage 2 */
    {
        i4_shift = IT_SHIFT_STAGE_2;

        m_temp_reg_22 = _mm_srli_si128(m_temp_reg_20, 8);
        m_temp_reg_20 = _mm_cvtepi16_epi32(m_temp_reg_20);
        m_temp_reg_23 = _mm_srli_si128(m_temp_reg_21, 8);
        m_temp_reg_21 = _mm_cvtepi16_epi32(m_temp_reg_21);
        m_temp_reg_22 = _mm_cvtepi16_epi32(m_temp_reg_22);
        m_temp_reg_23 = _mm_cvtepi16_epi32(m_temp_reg_23);

        /* c[4] stored in m_temp_reg_4 */
        {
            m_temp_reg_4 = _mm_sub_epi32(m_temp_reg_20, m_temp_reg_21);
        }

        /* c[3] stored in m_temp_reg_3 */
        {
            m_temp_reg_3 = _mm_mullo_epi32(m_temp_reg_22, m_coeff3);
        }

        /* c[0] stored in m_temp_reg_0 */
        {
            m_temp_reg_0 = _mm_add_epi32(m_temp_reg_20, m_temp_reg_21);
        }

        /* c[1] stored in m_temp_reg_1 */
        {
            m_temp_reg_1 = _mm_add_epi32(m_temp_reg_23, m_temp_reg_21);
        }

        /* c[2] stored in m_temp_reg_2 */
        {
            m_temp_reg_2 = _mm_sub_epi32(m_temp_reg_20, m_temp_reg_23);
        }

        /* c[4] stored in m_temp_reg_4 */
        {
            m_temp_reg_4 = _mm_add_epi32(m_temp_reg_4, m_temp_reg_23);
        }

        /* Stage 2 output generation */
        {
            m_temp_reg_30 = _mm_mullo_epi32(m_temp_reg_0, m_coeff1); //29*c0
            m_temp_reg_31 = _mm_mullo_epi32(m_temp_reg_1, m_coeff2); //55*c1

            m_rdng_factor = _mm_cvtsi32_si128((1 << (i4_shift - 1)));

            m_temp_reg_32 = _mm_mullo_epi32(m_temp_reg_1, m_coeff1); //29*c1
            m_temp_reg_33 = _mm_mullo_epi32(m_temp_reg_2, m_coeff2); //55*c2

            m_rdng_factor = _mm_unpacklo_epi32(m_rdng_factor, m_rdng_factor);

            m_temp_reg_34 = _mm_mullo_epi32(m_temp_reg_0, m_coeff2); //55*c0
            m_temp_reg_35 = _mm_mullo_epi32(m_temp_reg_2, m_coeff1); //29*c2
            m_temp_reg_36 = _mm_mullo_epi32(m_temp_reg_4, m_coeff3); //74*c4

            m_rdng_factor = _mm_unpacklo_epi64(m_rdng_factor, m_rdng_factor);
            m_count = _mm_cvtsi32_si128(i4_shift);

            m_temp_reg_4 = _mm_add_epi32(m_rdng_factor, m_temp_reg_3);
            m_temp_reg_20 = _mm_add_epi32(m_temp_reg_30, m_temp_reg_31);
            m_temp_reg_20 = _mm_add_epi32(m_temp_reg_20, m_temp_reg_4);

            m_temp_reg_21 = _mm_sub_epi32(m_temp_reg_33, m_temp_reg_32);
            m_temp_reg_21 = _mm_add_epi32(m_temp_reg_21, m_temp_reg_4);

            m_temp_reg_4 = _mm_sub_epi32(m_rdng_factor, m_temp_reg_3);
            m_temp_reg_23 = _mm_add_epi32(m_temp_reg_34, m_temp_reg_35);
            m_temp_reg_23 = _mm_add_epi32(m_temp_reg_23, m_temp_reg_4);

            m_temp_reg_22 = _mm_add_epi32(m_temp_reg_36, m_rdng_factor);

            m_temp_reg_20 = _mm_sra_epi32(m_temp_reg_20, m_count);
            m_temp_reg_21 = _mm_sra_epi32(m_temp_reg_21, m_count);
            m_temp_reg_23 = _mm_sra_epi32(m_temp_reg_23, m_count);
            m_temp_reg_22 = _mm_sra_epi32(m_temp_reg_22, m_count);

            m_temp_reg_20 = _mm_packs_epi32(m_temp_reg_20, m_temp_reg_21);
            m_temp_reg_21 = _mm_packs_epi32(m_temp_reg_22, m_temp_reg_23);
            m_temp_reg_22 = _mm_srli_si128(m_temp_reg_20, 8);
            m_temp_reg_23 = _mm_srli_si128(m_temp_reg_21, 8);

            m_temp_reg_24 = _mm_unpacklo_epi16(m_temp_reg_20, m_temp_reg_22);
            m_temp_reg_25 = _mm_unpacklo_epi16(m_temp_reg_21, m_temp_reg_23);

            m_temp_reg_20 = _mm_unpacklo_epi32(m_temp_reg_24, m_temp_reg_25);
            m_temp_reg_21 = _mm_unpackhi_epi32(m_temp_reg_24, m_temp_reg_25);
        }

        /* Recon and store */
        {
            WORD32 *pi4_dst = (WORD32 *)pu1_dst;

            m_temp_reg_0 = _mm_loadl_epi64((__m128i *)pu1_pred);
            pu1_pred += pred_strd;
            m_temp_reg_1 = _mm_loadl_epi64((__m128i *)pu1_pred);
            pu1_pred += pred_strd;
            m_temp_reg_2 = _mm_loadl_epi64((__m128i *)pu1_pred);
            pu1_pred += pred_strd;
            m_temp_reg_3 = _mm_loadl_epi64((__m128i *)pu1_pred);

            m_temp_reg_0 = _mm_cvtepu8_epi16(m_temp_reg_0);
            m_temp_reg_1 = _mm_cvtepu8_epi16(m_temp_reg_1);
            m_temp_reg_2 = _mm_cvtepu8_epi16(m_temp_reg_2);
            m_temp_reg_3 = _mm_cvtepu8_epi16(m_temp_reg_3);
            m_temp_reg_0 = _mm_unpacklo_epi64(m_temp_reg_0, m_temp_reg_1);
            m_temp_reg_1 = _mm_unpacklo_epi64(m_temp_reg_2, m_temp_reg_3);

            m_temp_reg_20 = _mm_add_epi16(m_temp_reg_20, m_temp_reg_0);
            m_temp_reg_21 = _mm_add_epi16(m_temp_reg_21, m_temp_reg_1);

            m_temp_reg_0 = _mm_packus_epi16(m_temp_reg_20, m_temp_reg_21);

            *pi4_dst = _mm_cvtsi128_si32(m_temp_reg_0);
            m_temp_reg_1 = _mm_srli_si128(m_temp_reg_0, 4);
            m_temp_reg_2 = _mm_srli_si128(m_temp_reg_0, 8);
            m_temp_reg_3 = _mm_srli_si128(m_temp_reg_0, 12);
            pu1_dst += dst_strd;
            pi4_dst = (WORD32 *)(pu1_dst);

            *pi4_dst = _mm_cvtsi128_si32(m_temp_reg_1);
            pu1_dst += dst_strd;
            pi4_dst = (WORD32 *)(pu1_dst);

            *pi4_dst = _mm_cvtsi128_si32(m_temp_reg_2);
            pu1_dst += dst_strd;
            pi4_dst = (WORD32 *)(pu1_dst);

            *pi4_dst = _mm_cvtsi128_si32(m_temp_reg_3);
        }
    }
}